

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O0

bool __thiscall
ON_V5x_DimStyle::OverrideFields(ON_V5x_DimStyle *this,ON_V5x_DimStyle *src,ON_V5x_DimStyle *parent)

{
  V5_TextDisplayMode a;
  bool bVar1;
  eArrowType eVar2;
  ON_Color color;
  int iVar3;
  arrow_type aVar4;
  ON_TextStyle *text_style;
  wchar_t *pwVar5;
  double dVar6;
  ON_UUID OVar7;
  ON_V5x_DimStyle *local_78;
  byte local_69;
  ON_V5x_DimStyle *copyfrom;
  uint uStack_28;
  bool bFromSrc;
  uint i;
  uint field_override_count;
  uint count;
  ON_V5x_DimStyle *parent_local;
  ON_V5x_DimStyle *src_local;
  ON_V5x_DimStyle *this_local;
  
  uStack_28 = 0;
  for (copyfrom._4_4_ = 0; copyfrom._4_4_ < 0x58; copyfrom._4_4_ = copyfrom._4_4_ + 1) {
    local_69 = 0;
    if (src->m_field_override_count != 0) {
      local_69 = src->m_field_override[copyfrom._4_4_];
    }
    this->m_field_override[copyfrom._4_4_] = (bool)(local_69 & 1);
    local_78 = parent;
    if ((bool)(local_69 & 1) != false) {
      uStack_28 = uStack_28 + 1;
      local_78 = src;
    }
    if (this != local_78) {
      switch(copyfrom._4_4_) {
      case 2:
        dVar6 = ExtExtension(local_78);
        SetExtExtension(this,dVar6);
        break;
      case 3:
        dVar6 = ExtOffset(local_78);
        SetExtOffset(this,dVar6);
        break;
      case 4:
        dVar6 = ArrowSize(local_78);
        SetArrowSize(this,dVar6);
        break;
      case 5:
        dVar6 = CenterMark(local_78);
        SetCenterMark(this,dVar6);
        break;
      case 6:
        dVar6 = TextGap(local_78);
        SetTextGap(this,dVar6);
        break;
      case 7:
        dVar6 = TextHeight(local_78);
        SetTextHeight(this,dVar6);
        break;
      case 8:
        a = TextAlignment(local_78);
        SetTextAlignment(this,a);
        break;
      case 9:
        eVar2 = ArrowType(local_78);
        SetArrowType(this,eVar2);
        break;
      case 10:
        iVar3 = AngularUnits(local_78);
        SetAngularUnits(this,iVar3);
        break;
      case 0xb:
        iVar3 = LengthFormat(local_78);
        SetLengthFormat(this,iVar3);
        break;
      case 0xc:
        iVar3 = AngleFormat(local_78);
        SetAngleFormat(this,iVar3);
        break;
      case 0xd:
        iVar3 = AngleResolution(local_78);
        SetAngleResolution(this,iVar3);
        break;
      case 0xe:
        iVar3 = LengthResolution(local_78);
        SetLengthResolution(this,iVar3);
        break;
      case 0xf:
        text_style = V5TextStyle(local_78);
        SetV5TextStyle(this,text_style);
        break;
      case 0x10:
        dVar6 = LengthFactor(local_78);
        SetLengthFactor(this,dVar6);
        break;
      case 0x11:
        bVar1 = Alternate(local_78);
        SetAlternate(this,bVar1);
        break;
      case 0x12:
        dVar6 = AlternateLengthFactor(local_78);
        SetAlternateLengthFactor(this,dVar6);
        break;
      case 0x13:
        iVar3 = AlternateLengthFormat(local_78);
        SetAlternateLengthFormat(this,iVar3);
        break;
      case 0x14:
        iVar3 = AlternateLengthResolution(local_78);
        SetAlternateLengthResolution(this,iVar3);
        break;
      case 0x15:
        iVar3 = AlternateAngleFormat(local_78);
        SetAlternateAngleFormat(this,iVar3);
        break;
      case 0x16:
        iVar3 = AlternateAngleResolution(local_78);
        SetAlternateAngleResolution(this,iVar3);
        break;
      case 0x17:
        pwVar5 = Prefix(local_78);
        SetPrefix(this,pwVar5);
        break;
      case 0x18:
        pwVar5 = Suffix(local_78);
        SetSuffix(this,pwVar5);
        break;
      case 0x19:
        pwVar5 = AlternatePrefix(local_78);
        SetAlternatePrefix(this,pwVar5);
        break;
      case 0x1a:
        pwVar5 = AlternateSuffix(local_78);
        SetAlternateSuffix(this,pwVar5);
        break;
      case 0x1b:
        dVar6 = DimExtension(local_78);
        SetDimExtension(this,dVar6);
        break;
      case 0x1c:
        dVar6 = LeaderArrowSize(local_78);
        SetLeaderArrowSize(this,dVar6);
        break;
      case 0x1d:
        eVar2 = LeaderArrowType(local_78);
        SetLeaderArrowType(this,eVar2);
        break;
      case 0x1e:
        bVar1 = SuppressExtension1(local_78);
        SetSuppressExtension1(this,bVar1);
        break;
      case 0x1f:
        bVar1 = SuppressExtension2(local_78);
        SetSuppressExtension2(this,bVar1);
        break;
      default:
        break;
      case 0x36:
        iVar3 = ToleranceStyle(local_78);
        SetToleranceStyle(this,iVar3);
        break;
      case 0x37:
        iVar3 = ToleranceResolution(local_78);
        SetToleranceResolution(this,iVar3);
        break;
      case 0x38:
        dVar6 = ToleranceUpperValue(local_78);
        SetToleranceUpperValue(this,dVar6);
        break;
      case 0x39:
        dVar6 = ToleranceLowerValue(local_78);
        SetToleranceLowerValue(this,dVar6);
        break;
      case 0x3a:
        dVar6 = ToleranceHeightScale(local_78);
        SetToleranceHeightScale(this,dVar6);
        break;
      case 0x3b:
        dVar6 = BaselineSpacing(local_78);
        SetBaselineSpacing(this,dVar6);
        break;
      case 0x3c:
        bVar1 = DrawTextMask(local_78);
        SetDrawTextMask(this,bVar1);
        break;
      case 0x3d:
        iVar3 = MaskColorSource(local_78);
        SetMaskColorSource(this,iVar3);
        break;
      case 0x3e:
        color = MaskColor(local_78);
        SetMaskColor(this,color);
        break;
      case 0x40:
        dVar6 = DimScale(local_78);
        SetDimScale(this,dVar6);
        break;
      case 0x41:
        iVar3 = DimScaleSource(local_78);
        SetDimScaleSource(this,iVar3);
        break;
      case 0x42:
        dVar6 = FixedExtensionLen(local_78);
        SetFixedExtensionLen(this,dVar6);
        break;
      case 0x43:
        bVar1 = FixedExtensionLenOn(local_78);
        SetFixedExtensionLenOn(this,bVar1);
        break;
      case 0x44:
        dVar6 = TextRotation(local_78);
        SetTextRotation(this,dVar6);
        break;
      case 0x45:
        iVar3 = AlternateToleranceResolution(local_78);
        SetAlternateToleranceResolution(this,iVar3);
        break;
      case 0x46:
        dVar6 = ToleranceHeightScale(local_78);
        SetToleranceHeightScale(this,dVar6);
        break;
      case 0x47:
        bVar1 = SuppressArrow1(local_78);
        SetSuppressArrow1(this,bVar1);
        break;
      case 0x48:
        bVar1 = SuppressArrow2(local_78);
        SetSuppressArrow2(this,bVar1);
        break;
      case 0x49:
        iVar3 = TextMoveLeader(local_78);
        SetTextMoveLeader(this,iVar3);
        break;
      case 0x4a:
        iVar3 = ArcLengthSymbol(local_78);
        SetArcLengthSymbol(this,iVar3);
        break;
      case 0x4b:
        dVar6 = StackHeightFraction(local_78);
        SetStackHeightFraction(this,dVar6);
        break;
      case 0x4c:
        iVar3 = StackFractionFormat(local_78);
        SetStackFractionFormat(this,iVar3);
        break;
      case 0x4d:
        dVar6 = AlternateRoundOff(local_78);
        SetAlternateRoundOff(this,dVar6);
        break;
      case 0x4e:
        dVar6 = RoundOff(local_78);
        SetRoundOff(this,dVar6);
        break;
      case 0x4f:
        iVar3 = AlternateZeroSuppress(local_78);
        SetAlternateZeroSuppress(this,iVar3);
        break;
      case 0x50:
        iVar3 = ToleranceZeroSuppress(local_78);
        SetToleranceZeroSuppress(this,iVar3);
        break;
      case 0x51:
        iVar3 = AngleZeroSuppress(local_78);
        SetAngleZeroSuppress(this,iVar3);
        break;
      case 0x52:
        iVar3 = ZeroSuppress(local_78);
        SetZeroSuppress(this,iVar3);
        break;
      case 0x53:
        bVar1 = AlternateBelow(local_78);
        SetAlternateBelow(this,bVar1);
        break;
      case 0x54:
        aVar4 = ArrowType1(local_78);
        SetArrowType1(this,aVar4);
        break;
      case 0x55:
        aVar4 = ArrowType2(local_78);
        SetArrowType2(this,aVar4);
        break;
      case 0x56:
        OVar7 = ArrowBlockId1(local_78);
        SetArrowBlockId1(this,OVar7);
        break;
      case 0x57:
        OVar7 = ArrowBlockId2(local_78);
        SetArrowBlockId2(this,OVar7);
      }
    }
  }
  this->m_field_override_count = uStack_28;
  return true;
}

Assistant:

bool ON_V5x_DimStyle::OverrideFields(const ON_V5x_DimStyle& src, const ON_V5x_DimStyle& parent)
{
  // NOTE WELL:
  //  "this" could be src or parent, so do not modify member values until they are not longer needed.

  const unsigned int count = (unsigned int)(sizeof(m_field_override)/sizeof(m_field_override[0]));

  unsigned int field_override_count = 0;

  for(unsigned int i = 0; i < count; i++)
  {
    const bool bFromSrc = (src.m_field_override_count > 0 && src.m_field_override[i]);
    m_field_override[i] = bFromSrc;
    if ( bFromSrc )
      field_override_count++;
    const ON_V5x_DimStyle* copyfrom = bFromSrc ? (&src) : (&parent);

    if ( this == copyfrom )
      continue;

    switch((Field)i)
    {
    case Field::fn_extextension:
      SetExtExtension(copyfrom->ExtExtension());
      break;
    case Field::fn_extoffset:
      SetExtOffset(copyfrom->ExtOffset());
      break;
    case Field::fn_arrowsize:
      SetArrowSize(copyfrom->ArrowSize());
      break;
    case Field::fn_centermark:
      SetCenterMark(copyfrom->CenterMark());
      break;
    case Field::fn_textgap:
      SetTextGap(copyfrom->TextGap());
      break;
    case Field::fn_textheight:
      SetTextHeight(copyfrom->TextHeight());
      break;
    case Field::fn_textalign:
      SetTextAlignment(copyfrom->TextAlignment());
      break;
    case Field::fn_arrowtype:
      SetArrowType((eArrowType)copyfrom->ArrowType());
      break;
    case Field::fn_angularunits:
      SetAngularUnits((eArrowType)copyfrom->AngularUnits());
      break;
    case Field::fn_lengthformat:
      SetLengthFormat(copyfrom->LengthFormat());
      break;
    case Field::fn_angleformat:
      SetAngleFormat(copyfrom->AngleFormat());
      break;
    case Field::fn_angleresolution:
      SetAngleResolution(copyfrom->AngleResolution());
      break;
    case Field::fn_lengthresolution:
      SetLengthResolution(copyfrom->LengthResolution());
      break;
    case Field::fn_fontindex:
      SetV5TextStyle(copyfrom->V5TextStyle());
      break;
    case Field::fn_lengthfactor:
      SetLengthFactor(copyfrom->LengthFactor());
      break;
    case Field::fn_bAlternate:
      SetAlternate(copyfrom->Alternate());
      break;
    case Field::fn_alternate_lengthfactor:
      SetAlternateLengthFactor(copyfrom->AlternateLengthFactor());
      break;
    case Field::fn_alternate_lengthformat:
      SetAlternateLengthFormat(copyfrom->AlternateLengthFormat());
      break;
    case Field::fn_alternate_lengthresolution:
      SetAlternateLengthResolution(copyfrom->AlternateLengthResolution());
      break;
    case Field::fn_alternate_angleformat:
      SetAlternateAngleFormat(copyfrom->AlternateAngleFormat());
      break;
    case Field::fn_alternate_angleresolution:
      SetAlternateAngleResolution(copyfrom->AlternateAngleResolution());
      break;
    case Field::fn_prefix:
      SetPrefix(copyfrom->Prefix());
      break;
    case Field::fn_suffix:
      SetSuffix(copyfrom->Suffix());
      break;
    case Field::fn_alternate_prefix:
      SetAlternatePrefix(copyfrom->AlternatePrefix());
      break;
    case Field::fn_alternate_suffix:
      SetAlternateSuffix(copyfrom->AlternateSuffix());
      break;
    case Field::fn_dimextension:
      SetDimExtension(copyfrom->DimExtension());
      break;
    case Field::fn_leaderarrowsize:
      SetLeaderArrowSize(copyfrom->LeaderArrowSize());
      break;
    case Field::fn_leaderarrowtype:
      SetLeaderArrowType((eArrowType)copyfrom->LeaderArrowType());
      break;
    case Field::fn_suppressextension1:
      SetSuppressExtension1(copyfrom->SuppressExtension1());
      break;
    case Field::fn_suppressextension2:
      SetSuppressExtension2(copyfrom->SuppressExtension2());
      break;
    case Field::fn_tolerance_style:
      SetToleranceStyle(copyfrom->ToleranceStyle());
      break;
    case Field::fn_tolerance_resolution:
      SetToleranceResolution(copyfrom->ToleranceResolution());
      break;
    case Field::fn_tolerance_upper_value:
      SetToleranceUpperValue(copyfrom->ToleranceUpperValue());
      break;
    case Field::fn_tolerance_lower_value:
      SetToleranceLowerValue(copyfrom->ToleranceLowerValue());
      break;
    case Field::fn_tolerance_height_scale:
      SetToleranceHeightScale(copyfrom->ToleranceHeightScale());
      break;
    case Field::fn_baseline_spacing:
      SetBaselineSpacing(copyfrom->BaselineSpacing());
      break;
    case Field::fn_draw_mask:
      SetDrawTextMask(copyfrom->DrawTextMask());
      break;
    case Field::fn_mask_color_source:
      SetMaskColorSource(copyfrom->MaskColorSource());
      break;
    case Field::fn_mask_color:
      SetMaskColor(copyfrom->MaskColor());
      break;
    case Field::fn_dimscale:
      SetDimScale(copyfrom->DimScale());
      break;
    case Field::fn_dimscale_source:
      SetDimScaleSource(copyfrom->DimScaleSource());
      break;

    case Field::fn_fixed_extension_len:
      SetFixedExtensionLen(copyfrom->FixedExtensionLen());
      break;
    case Field::fn_fixed_extension_on:
      SetFixedExtensionLenOn(copyfrom->FixedExtensionLenOn());
      break;
    case Field::fn_text_rotation:
      SetTextRotation(copyfrom->TextRotation());
      break;
    case Field::fn_tolerance_alt_resolution:
      SetAlternateToleranceResolution(copyfrom->AlternateToleranceResolution());
      break;
    case Field::fn_tolerance_textheight_fraction:
      SetToleranceHeightScale(copyfrom->ToleranceHeightScale());
      break;
    case Field::fn_suppress_arrow1:
      SetSuppressArrow1(copyfrom->SuppressArrow1());
      break;
    case Field::fn_suppress_arrow2:
      SetSuppressArrow2(copyfrom->SuppressArrow2());
      break;
    case Field::fn_textmove_leader:
      SetTextMoveLeader(copyfrom->TextMoveLeader());
      break;
    case Field::fn_arclength_sym:
      SetArcLengthSymbol(copyfrom->ArcLengthSymbol());
      break;
    case Field::fn_stack_textheight_fraction:
      SetStackHeightFraction(copyfrom->StackHeightFraction());
      break;
    case Field::fn_stack_format:
      SetStackFractionFormat(copyfrom->StackFractionFormat());
      break;
    case Field::fn_alt_round:
      SetAlternateRoundOff(copyfrom->AlternateRoundOff());
      break;
    case Field::fn_round:
      SetRoundOff(copyfrom->RoundOff());
      break;
    case Field::fn_alt_zero_suppress:
      SetAlternateZeroSuppress(copyfrom->AlternateZeroSuppress());
      break;
    case Field::fn_tol_zero_suppress:
      SetToleranceZeroSuppress(copyfrom->ToleranceZeroSuppress());
      break;
    case Field::fn_ang_zero_suppress:
      SetAngleZeroSuppress(copyfrom->AngleZeroSuppress());
      break;
    case Field::fn_zero_suppress:
      SetZeroSuppress(copyfrom->ZeroSuppress());
      break;
    case Field::fn_alt_below:
      SetAlternateBelow(copyfrom->AlternateBelow());
      break;
    case Field::fn_dim_arrow_type1:
      SetArrowType1(copyfrom->ArrowType1());
      break;
    case Field::fn_dim_arrow_type2:
      SetArrowType2(copyfrom->ArrowType2());
      break;
    case Field::fn_dim_arrow_blockname1:
      SetArrowBlockId1(copyfrom->ArrowBlockId1());
      break;
    case Field::fn_dim_arrow_blockname2:
      SetArrowBlockId2(copyfrom->ArrowBlockId2());
      break;
    default:
      break;
    }
  }

  m_field_override_count = field_override_count;

  return true;
}